

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QOpenFolderLineEdit.cpp
# Opt level: O3

void __thiscall
QOpenFolderLineEditPrivate::~QOpenFolderLineEditPrivate(QOpenFolderLineEditPrivate *this)

{
  QObject::~QObject(&this->super_QObject);
  operator_delete(this,0x28);
  return;
}

Assistant:

class QOpenFolderLineEditPrivate : public QObject {
    Q_OBJECT

public:
    explicit QOpenFolderLineEditPrivate(QOpenFolderLineEdit *widgetP)
        : QObject(widgetP)
        , widget(widgetP)
        , action(new QFileAction(this)) {
        Q_ASSERT(widget);

        action->setType(QFileAction::Type::OpenFolder);
        widget->addAction(action, position);

        connect(widget, &QLineEdit::textChanged, this, &QOpenFolderLineEditPrivate::textChanged);
        connect(action, &QFileAction::filePathChanged, this, &QOpenFolderLineEditPrivate::filePathChanged);
        connect(action, &QFileAction::filePathChanged, widget, &QOpenFolderLineEdit::filePathChanged);
    }

    void textChanged(const QString &text) {
        action->setFilePath(text);
    }